

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

reverse_iterator * __thiscall llvm::sys::path::reverse_iterator::operator++(reverse_iterator *this)

{
  unsigned_long uVar1;
  char cVar2;
  bool bVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  anon_unknown_dwarf_21af95 *this_00;
  size_t *__b;
  StringRef str;
  StringRef str_00;
  bool local_121;
  size_t start_pos;
  size_t local_e0;
  size_t end_pos;
  size_t local_d0;
  size_t local_c8;
  size_t root_dir_pos;
  reverse_iterator *this_local;
  reverse_iterator *local_b0;
  char *local_a8;
  size_t *local_a0;
  unsigned_long local_98;
  size_t local_90;
  unsigned_long local_88;
  reverse_iterator *local_80;
  undefined1 local_78 [16];
  size_t local_68;
  size_t local_60;
  reverse_iterator *local_58;
  reverse_iterator *local_40;
  unsigned_long local_20;
  anon_unknown_dwarf_21af95 *local_18;
  undefined1 *local_10;
  
  end_pos = (size_t)(this->Path).Data;
  local_d0 = (this->Path).Length;
  str.Length._0_4_ = this->S;
  str.Data = (char *)local_d0;
  str.Length._4_4_ = 0;
  root_dir_pos = (size_t)this;
  local_c8 = anon_unknown.dwarf_21af95::root_dir_start
                       ((anon_unknown_dwarf_21af95 *)end_pos,str,(Style)local_d0);
  local_e0 = this->Position;
  while( true ) {
    local_121 = false;
    if ((local_e0 != 0) && (local_121 = false, local_e0 - 1 != local_c8)) {
      cVar2 = StringRef::operator[](&this->Path,local_e0 - 1);
      local_121 = is_separator(cVar2,this->S);
    }
    if (local_121 == false) break;
    local_e0 = local_e0 - 1;
  }
  local_b0 = this;
  if ((this->Position == (this->Path).Length) && (local_40 = this, (this->Path).Length != 0)) {
    cVar2 = StringRef::back(&this->Path);
    bVar3 = is_separator(cVar2,this->S);
    if ((bVar3) && ((local_c8 == 0xffffffffffffffff || (local_c8 < local_e0 - 1)))) {
      this->Position = this->Position - 1;
      local_a0 = &start_pos;
      local_a8 = ".";
      start_pos = (long)"-%%%%%%." + 7;
      sVar4 = strlen(".");
      (this->Component).Data = (char *)start_pos;
      (this->Component).Length = sVar4;
      return this;
    }
  }
  local_88 = 0;
  local_90 = local_e0;
  local_80 = this;
  puVar5 = std::min<unsigned_long>(&local_88,&(this->Path).Length);
  local_88 = *puVar5;
  this_00 = (anon_unknown_dwarf_21af95 *)((this->Path).Data + local_88);
  local_98 = (this->Path).Length - local_88;
  puVar5 = std::min<unsigned_long>(&local_90,&local_98);
  local_20 = *puVar5;
  local_10 = local_78;
  str_00.Length._0_4_ = this->S;
  str_00.Data = (char *)local_20;
  str_00.Length._4_4_ = 0;
  local_18 = this_00;
  sVar6 = anon_unknown.dwarf_21af95::filename_pos(this_00,str_00,(Style)local_20);
  local_68 = local_e0;
  __b = &(this->Path).Length;
  local_60 = sVar6;
  local_58 = this;
  puVar5 = std::min<unsigned_long>(&local_60,__b);
  local_60 = *puVar5;
  puVar5 = std::max<unsigned_long>(&local_60,&local_68);
  puVar5 = std::min<unsigned_long>(puVar5,__b);
  uVar1 = *puVar5;
  (this->Component).Data = (this->Path).Data + local_60;
  (this->Component).Length = uVar1 - local_60;
  this->Position = sVar6;
  return this;
}

Assistant:

reverse_iterator &reverse_iterator::operator++() {
  size_t root_dir_pos = root_dir_start(Path, S);

  // Skip separators unless it's the root directory.
  size_t end_pos = Position;
  while (end_pos > 0 && (end_pos - 1) != root_dir_pos &&
         is_separator(Path[end_pos - 1], S))
    --end_pos;

  // Treat trailing '/' as a '.', unless it is the root dir.
  if (Position == Path.size() && !Path.empty() &&
      is_separator(Path.back(), S) &&
      (root_dir_pos == StringRef::npos || end_pos - 1 > root_dir_pos)) {
    --Position;
    Component = ".";
    return *this;
  }

  // Find next separator.
  size_t start_pos = filename_pos(Path.substr(0, end_pos), S);
  Component = Path.slice(start_pos, end_pos);
  Position = start_pos;
  return *this;
}